

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

int32_t __thiscall icu_63::UCharsTrie::getNextUChars(UCharsTrie *this,Appendable *out)

{
  char16_t *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint local_2c;
  char16_t *pcStack_28;
  int32_t node;
  UChar *pos;
  Appendable *out_local;
  UCharsTrie *this_local;
  
  pcVar1 = this->pos_;
  if (pcVar1 == (char16_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (this->remainingMatchLength_ < 0) {
    pcStack_28 = pcVar1 + 1;
    local_2c = (uint)(ushort)*pcVar1;
    if (0x3f < local_2c) {
      if ((*pcVar1 & 0x8000U) != 0) {
        return 0;
      }
      pcStack_28 = skipNodeValue(pcStack_28,local_2c);
      local_2c = local_2c & 0x3f;
    }
    if (local_2c < 0x30) {
      if (local_2c == 0) {
        local_2c = (uint)(ushort)*pcStack_28;
        pcStack_28 = pcStack_28 + 1;
      }
      this_local._4_4_ = local_2c + 1;
      (*(out->super_UObject)._vptr_UObject[6])();
      getNextBranchUChars(pcStack_28,this_local._4_4_,out);
    }
    else {
      (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pcStack_28);
      this_local._4_4_ = 1;
    }
  }
  else {
    (*(out->super_UObject)._vptr_UObject[3])
              (out,(ulong)(ushort)*pcVar1,in_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),*pcVar1));
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UCharsTrie::getNextUChars(Appendable &out) const {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return 0;
    }
    if(remainingMatchLength_>=0) {
        out.appendCodeUnit(*pos);  // Next unit of a pending linear-match node.
        return 1;
    }
    int32_t node=*pos++;
    if(node>=kMinValueLead) {
        if(node&kValueIsFinal) {
            return 0;
        } else {
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    if(node<kMinLinearMatch) {
        if(node==0) {
            node=*pos++;
        }
        out.reserveAppendCapacity(++node);
        getNextBranchUChars(pos, node, out);
        return node;
    } else {
        // First unit of the linear-match node.
        out.appendCodeUnit(*pos);
        return 1;
    }
}